

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

void accum_global_gauden_full
               (vector_t ****acc,vector_t ****l_acc,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_4c;
  uint local_48;
  uint32 ll;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 ii;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_lcl2glb_local;
  uint32 *lcl2glb_local;
  gauden_t *g_local;
  vector_t ****l_acc_local;
  vector_t ****acc_local;
  
  if (acc != (vector_t ****)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (j = 0; j < n_lcl2glb; j = j + 1) {
      uVar3 = lcl2glb[j];
      for (l = 0; l < uVar1; l = l + 1) {
        for (ll = 0; ll < uVar2; ll = ll + 1) {
          for (local_48 = 0; local_48 < g->veclen[l]; local_48 = local_48 + 1) {
            for (local_4c = 0; local_4c < g->veclen[l]; local_4c = local_4c + 1) {
              acc[uVar3][l][ll][local_48][local_4c] =
                   l_acc[j][l][ll][local_48][local_4c] + acc[uVar3][l][ll][local_48][local_4c];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
accum_global_gauden_full(vector_t ****acc,
			 vector_t ****l_acc,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l, ll;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    for (ll = 0; ll < g->veclen[j]; ll++) {
			acc[i][j][k][l][ll] += l_acc[ii][j][k][l][ll];
		    }
		}
	    }
	}
    }
}